

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.cpp
# Opt level: O3

istream * operator>>(istream *stream,skip *x)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char c;
  char local_21;
  
  lVar3 = *(long *)stream;
  lVar2 = *(long *)(lVar3 + -0x18);
  uVar1 = *(uint *)(stream + lVar2 + 0x18);
  *(uint *)(stream + lVar2 + 0x18) = uVar1 & 0xffffefff;
  lVar3 = *(long *)(lVar3 + -0x18);
  if ((((byte)stream[lVar3 + 0x20] & 5) == 0) && (pcVar4 = *(char **)x, *pcVar4 != '\0')) {
    do {
      pcVar4 = pcVar4 + 1;
      std::operator>>(stream,&local_21);
      lVar3 = *(long *)(*(long *)stream + -0x18);
      if (((byte)stream[lVar3 + 0x20] & 5) != 0) break;
    } while (*pcVar4 != '\0');
  }
  *(uint *)(stream + lVar3 + 0x18) = uVar1;
  return stream;
}

Assistant:

std::istream& operator >> (std::istream& stream, const skip& x)
{
    std::ios_base::fmtflags f = stream.flags();
    stream >> std::noskipws;

    char c;
    const char* text = x.text;
    while (stream && *text++)
        stream >> c;

    stream.flags(f);
    return stream;
}